

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O2

void P_SpawnScrollers(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  side_t *psVar4;
  side_t *psVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  FLineSpecial *pFVar10;
  long lVar11;
  DScroller *pDVar12;
  line_t_conflict *plVar13;
  EScrollPos EVar14;
  uint accel;
  ulong uVar15;
  line_t_conflict *plVar16;
  uint j;
  double dx;
  uint local_84;
  FSectorTagIterator itr;
  TArray<int,_int> copyscrollers;
  double local_58;
  double dStack_50;
  
  plVar16 = lines;
  copyscrollers.Array = (int *)0x0;
  copyscrollers.Most = 0;
  copyscrollers.Count = 0;
  plVar13 = lines;
  iVar7 = numlines;
  for (local_84 = 0; (int)local_84 < iVar7; local_84 = local_84 + 1) {
    if (plVar13[(int)local_84].special == 0x3a) {
      bVar6 = FTagManager::SectorHasTag
                        (&tagManager,(sector_t *)plVar13[(int)local_84].frontsector,
                         plVar13[(int)local_84].args[0]);
      if (!bVar6) {
        TArray<int,_int>::Push(&copyscrollers,(int *)&local_84);
      }
      plVar13 = lines;
      lines[(int)local_84].special = 0;
      iVar7 = numlines;
    }
  }
  local_84 = 0;
  do {
    if (iVar7 <= (int)local_84) {
      TArray<int,_int>::~TArray(&copyscrollers);
      return;
    }
    uVar8 = plVar16->special;
    pFVar10 = P_GetLineSpecialInfo(uVar8);
    if (pFVar10 != (FLineSpecial *)0x0) {
      uVar15 = (ulong)pFVar10->map_args;
      while (uVar15 < 5) {
        if (plVar16->args[uVar15] == 0) {
          uVar15 = uVar15 + 1;
        }
        else {
          uVar15 = uVar15 + 1;
          Printf("Line %d (type %d:%s), arg %u is %d (should be 0)\n",(ulong)local_84,(ulong)uVar8,
                 pFVar10->name,uVar15 & 0xffffffff);
        }
      }
    }
    plVar16->special = 0;
    psVar5 = sides;
    if (uVar8 - 0xde < 3) {
      uVar1 = plVar16->args[1];
      if ((uVar1 & 3) == 0) {
        accel = 0;
        iVar7 = -1;
      }
      else {
        iVar7 = (int)(((long)plVar16->sidedef[0]->sector - (long)sectors) / 0x218);
        accel = uVar1 >> 1 & 1;
      }
      if (uVar8 == 0xde || (uVar1 & 4) != 0) {
        local_58 = (plVar16->delta).X;
        dStack_50 = (plVar16->delta).Y;
      }
      else {
        local_58 = (double)((int)*(undefined8 *)(plVar16->args + 3) + -0x80);
        dStack_50 = (double)((int)((ulong)*(undefined8 *)(plVar16->args + 3) >> 0x20) + -0x80);
      }
      local_58 = local_58 * 0.03125;
      dStack_50 = dStack_50 * 0.03125;
    }
    else {
      local_58 = 0.0;
      dStack_50 = 0.0;
      accel = 0;
      iVar7 = -1;
    }
    if (uVar8 - 0xdd < 5) {
      dx = -local_58;
      switch(uVar8) {
      case 0xdd:
        lVar11 = (long)lines[(int)local_84].sidedef[0] - (long)sides;
        if (plVar16->args[0] == 0) {
          iVar7 = plVar16->args[1];
          iVar9 = plVar16->args[2];
          iVar2 = plVar16->args[4];
          iVar3 = plVar16->args[3];
          pDVar12 = (DScroller *)DObject::operator_new(0x90);
          DScroller::DScroller
                    (pDVar12,sc_side,(double)(iVar7 - iVar9) * 0.015625,
                     (double)(iVar2 - iVar3) * 0.015625,-1,(int)(lVar11 / 0xc0),accel,scw_all);
        }
        break;
      case 0xde:
        itr.searchtag = plVar16->args[0];
        itr.start = tagManager.IDHashFirst[itr.searchtag & 0xff];
        while (uVar8 = FLineIdIterator::Next((FLineIdIterator *)&itr), -1 < (int)uVar8) {
          if (uVar8 != local_84) {
            pDVar12 = (DScroller *)DObject::operator_new(0x90);
            DScroller::DScroller(pDVar12,local_58,dStack_50,lines + uVar8,iVar7,accel,scw_all);
          }
        }
        break;
      case 0xdf:
        itr.searchtag = plVar16->args[0];
        if (plVar16->args[2] != 1) {
          if (itr.searchtag == 0) {
            itr.start = 0;
          }
          else {
            itr.start = tagManager.TagHashFirst[itr.searchtag & 0xff];
          }
          while (iVar9 = FSectorTagIterator::Next(&itr), -1 < iVar9) {
            pDVar12 = (DScroller *)DObject::operator_new(0x90);
            DScroller::DScroller(pDVar12,sc_floor,dx,dStack_50,iVar7,iVar9,accel,scw_all);
          }
          for (uVar15 = 0; plVar13 = lines, uVar15 < (ulong)copyscrollers._8_8_ >> 0x20;
              uVar15 = uVar15 + 1) {
            iVar9 = copyscrollers.Array[uVar15];
            if ((lines[iVar9].args[0] == plVar16->args[0]) && ((lines[iVar9].args[1] & 2) != 0)) {
              pDVar12 = (DScroller *)DObject::operator_new(0x90);
              DScroller::DScroller
                        (pDVar12,sc_floor,dx,dStack_50,iVar7,
                         (int)(((long)plVar13[iVar9].frontsector - (long)sectors) / 0x218),accel,
                         scw_all);
            }
          }
          if (plVar16->args[2] < 1) break;
          itr.searchtag = plVar16->args[0];
        }
        if (itr.searchtag == 0) {
          itr.start = 0;
        }
        else {
          itr.start = tagManager.TagHashFirst[itr.searchtag & 0xff];
        }
        while (iVar9 = FSectorTagIterator::Next(&itr), -1 < iVar9) {
          pDVar12 = (DScroller *)DObject::operator_new(0x90);
          DScroller::DScroller(pDVar12,sc_carry,local_58,dStack_50,iVar7,iVar9,accel,scw_all);
        }
        for (uVar15 = 0; plVar13 = lines, uVar15 < (ulong)copyscrollers._8_8_ >> 0x20;
            uVar15 = uVar15 + 1) {
          iVar9 = copyscrollers.Array[uVar15];
          if ((lines[iVar9].args[0] == plVar16->args[0]) && ((lines[iVar9].args[1] & 4) != 0)) {
            pDVar12 = (DScroller *)DObject::operator_new(0x90);
            DScroller::DScroller
                      (pDVar12,sc_carry,local_58,dStack_50,iVar7,
                       (int)(((long)plVar13[iVar9].frontsector - (long)sectors) / 0x218),accel,
                       scw_all);
          }
        }
        break;
      case 0xe0:
        itr.searchtag = plVar16->args[0];
        if (itr.searchtag == 0) {
          itr.start = 0;
        }
        else {
          itr.start = tagManager.TagHashFirst[(byte)itr.searchtag];
        }
        while (iVar9 = FSectorTagIterator::Next(&itr), -1 < iVar9) {
          pDVar12 = (DScroller *)DObject::operator_new(0x90);
          DScroller::DScroller(pDVar12,sc_ceiling,dx,dStack_50,iVar7,iVar9,accel,scw_all);
        }
        for (uVar15 = 0; plVar13 = lines, uVar15 < (ulong)copyscrollers._8_8_ >> 0x20;
            uVar15 = uVar15 + 1) {
          iVar9 = copyscrollers.Array[uVar15];
          if ((lines[iVar9].args[0] == plVar16->args[0]) && ((lines[iVar9].args[1] & 1) != 0)) {
            pDVar12 = (DScroller *)DObject::operator_new(0x90);
            DScroller::DScroller
                      (pDVar12,sc_ceiling,dx,dStack_50,iVar7,
                       (int)(((long)plVar13[iVar9].frontsector - (long)sectors) / 0x218),accel,
                       scw_all);
          }
        }
        break;
      case 0xe1:
        psVar4 = lines[(int)local_84].sidedef[0];
        pDVar12 = (DScroller *)DObject::operator_new(0x90);
        iVar7 = (int)(((long)psVar4 - (long)psVar5) / 0xc0);
        EVar14 = plVar16->args[0];
        if (6 < EVar14 - scw_top) {
          EVar14 = scw_all;
        }
        DScroller::DScroller
                  (pDVar12,sc_side,-sides[iVar7].textures[1].xOffset,
                   sides[iVar7].textures[1].yOffset,-1,iVar7,accel,EVar14);
      }
    }
    else {
      switch(uVar8) {
      case 100:
        plVar16->special = 100;
        psVar4 = sides;
        psVar5 = lines[(int)local_84].sidedef[0];
        pDVar12 = (DScroller *)DObject::operator_new(0x90);
        EVar14 = plVar16->args[1];
        if (6 < EVar14 - scw_top) {
          EVar14 = scw_all;
        }
        DScroller::DScroller
                  (pDVar12,sc_side,(double)plVar16->args[0] * 0.015625,0.0,-1,
                   (int)(((long)psVar5 - (long)psVar4) / 0xc0),accel,EVar14);
        break;
      case 0x65:
        plVar16->special = 0x65;
        psVar4 = sides;
        psVar5 = lines[(int)local_84].sidedef[0];
        pDVar12 = (DScroller *)DObject::operator_new(0x90);
        EVar14 = plVar16->args[1];
        if (6 < EVar14 - scw_top) {
          EVar14 = scw_all;
        }
        DScroller::DScroller
                  (pDVar12,sc_side,(double)-plVar16->args[0] * 0.015625,0.0,-1,
                   (int)(((long)psVar5 - (long)psVar4) / 0xc0),accel,EVar14);
        break;
      case 0x66:
        plVar16->special = 0x66;
        psVar4 = sides;
        psVar5 = lines[(int)local_84].sidedef[0];
        pDVar12 = (DScroller *)DObject::operator_new(0x90);
        EVar14 = plVar16->args[1];
        if (6 < EVar14 - scw_top) {
          EVar14 = scw_all;
        }
        DScroller::DScroller
                  (pDVar12,sc_side,0.0,(double)plVar16->args[0] * 0.015625,-1,
                   (int)(((long)psVar5 - (long)psVar4) / 0xc0),accel,EVar14);
        break;
      case 0x67:
        plVar16->special = 0x67;
        psVar4 = sides;
        psVar5 = lines[(int)local_84].sidedef[0];
        pDVar12 = (DScroller *)DObject::operator_new(0x90);
        EVar14 = plVar16->args[1];
        if (6 < EVar14 - scw_top) {
          EVar14 = scw_all;
        }
        DScroller::DScroller
                  (pDVar12,sc_side,0.0,(double)-plVar16->args[0] * 0.015625,-1,
                   (int)(((long)psVar5 - (long)psVar4) / 0xc0),accel,EVar14);
        break;
      default:
        plVar16->special = uVar8;
      }
    }
    local_84 = local_84 + 1;
    plVar16 = plVar16 + 1;
    iVar7 = numlines;
  } while( true );
}

Assistant:

void P_SpawnScrollers(void)
{
	int i;
	line_t *l = lines;
	TArray<int> copyscrollers;

	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Sector_CopyScroller)
		{
			// don't allow copying the scroller if the sector has the same tag as it would just duplicate it.
			if (!tagManager.SectorHasTag(lines[i].frontsector, lines[i].args[0]))
			{
				copyscrollers.Push(i);
			}
			lines[i].special = 0;
		}
	}

	for (i = 0; i < numlines; i++, l++)
	{
		double dx;	// direction and speed of scrolling
		double dy;
		int control = -1, accel = 0;		// no control sector or acceleration
		int special = l->special;

		// Check for undefined parameters that are non-zero and output messages for them.
		// We don't report for specials we don't understand.
		FLineSpecial *spec = P_GetLineSpecialInfo(special);
		if (spec != NULL)
		{
			int max = spec->map_args;
			for (unsigned arg = max; arg < countof(l->args); ++arg)
			{
				if (l->args[arg] != 0)
				{
					Printf("Line %d (type %d:%s), arg %u is %d (should be 0)\n",
						i, special, spec->name, arg+1, l->args[arg]);
				}
			}
		}

		// killough 3/7/98: Types 245-249 are same as 250-254 except that the
		// first side's sector's heights cause scrolling when they change, and
		// this linedef controls the direction and speed of the scrolling. The
		// most complicated linedef since donuts, but powerful :)
		//
		// killough 3/15/98: Add acceleration. Types 214-218 are the same but
		// are accelerative.

		// [RH] Assume that it's a scroller and zero the line's special.
		l->special = 0;

		dx = dy = 0;	// Shut up, GCC

		if (special == Scroll_Ceiling ||
			special == Scroll_Floor ||
			special == Scroll_Texture_Model)
		{
			if (l->args[1] & 3)
			{
				// if 1, then displacement
				// if 2, then accelerative (also if 3)
				control = int(l->sidedef[0]->sector - sectors);
				if (l->args[1] & 2)
					accel = 1;
			}
			if (special == Scroll_Texture_Model ||
				l->args[1] & 4)
			{
				// The line housing the special controls the
				// direction and speed of scrolling.
				dx = l->Delta().X / 32.;
				dy = l->Delta().Y / 32.;
			}
			else
			{
				// The speed and direction are parameters to the special.
				dx = (l->args[3] - 128) / 32.;
				dy = (l->args[4] - 128) / 32.;
			}
		}

		switch (special)
		{
			int s;

		case Scroll_Ceiling:
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
			{
				new DScroller(EScroll::sc_ceiling, -dx, dy, control, s, accel);
			}
			for (unsigned j = 0; j < copyscrollers.Size(); j++)
			{
				line_t *line = &lines[copyscrollers[j]];

				if (line->args[0] == l->args[0] && (line->args[1] & 1))
				{
					new DScroller(EScroll::sc_ceiling, -dx, dy, control, int(line->frontsector - sectors), accel);
				}
			}
			break;
		}

		case Scroll_Floor:
			if (l->args[2] != 1)
			{ // scroll the floor texture
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					new DScroller (EScroll::sc_floor, -dx, dy, control, s, accel);
				}
				for(unsigned j = 0;j < copyscrollers.Size(); j++)
				{
					line_t *line = &lines[copyscrollers[j]];

					if (line->args[0] == l->args[0] && (line->args[1] & 2))
					{
						new DScroller (EScroll::sc_floor, -dx, dy, control, int(line->frontsector-sectors), accel);
					}
				}
			}

			if (l->args[2] > 0)
			{ // carry objects on the floor
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					new DScroller (EScroll::sc_carry, dx, dy, control, s, accel);
				}
				for(unsigned j = 0;j < copyscrollers.Size(); j++)
				{
					line_t *line = &lines[copyscrollers[j]];

					if (line->args[0] == l->args[0] && (line->args[1] & 4))
					{
						new DScroller (EScroll::sc_carry, dx, dy, control, int(line->frontsector-sectors), accel);
					}
				}
			}
			break;

		// killough 3/1/98: scroll wall according to linedef
		// (same direction and speed as scrolling floors)
		case Scroll_Texture_Model:
		{
			FLineIdIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
			{
				if (s != i)
					new DScroller(dx, dy, lines + s, control, accel);
			}
			break;
		}

		case Scroll_Texture_Offsets:
			// killough 3/2/98: scroll according to sidedef offsets
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, -sides[s].GetTextureXOffset(side_t::mid),
				sides[s].GetTextureYOffset(side_t::mid), -1, s, accel, SCROLLTYPE(l->args[0]));
			break;

		case Scroll_Texture_Left:
			l->special = special;	// Restore the special, for compat_useblocking's benefit.
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, l->args[0] / 64., 0,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Right:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, -l->args[0] / 64., 0,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Up:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, 0, l->args[0] / 64.,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Down:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, 0, -l->args[0] / 64.,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Both:
			s = int(lines[i].sidedef[0] - sides);
			if (l->args[0] == 0) {
				dx = (l->args[1] - l->args[2]) / 64.;
				dy = (l->args[4] - l->args[3]) / 64.;
				new DScroller (EScroll::sc_side, dx, dy, -1, s, accel);
			}
			break;

		default:
			// [RH] It wasn't a scroller after all, so restore the special.
			l->special = special;
			break;
		}
	}
}